

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

size_t __thiscall
AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize
          (AccountingTestMemoryAllocator *this,char *memory)

{
  AccountingTestMemoryAllocatorMemoryNode *foundNode;
  AccountingTestMemoryAllocatorMemoryNode *pAVar1;
  AccountingTestMemoryAllocatorMemoryNode *pAVar2;
  size_t sVar3;
  TestMemoryAllocator *pTVar4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  
  pAVar1 = this->head_;
  if ((pAVar1 == (AccountingTestMemoryAllocatorMemoryNode *)0x0) || (pAVar1->memory_ != memory)) {
    sVar3 = 0;
    for (pAVar2 = this->head_; pAVar2 != (AccountingTestMemoryAllocatorMemoryNode *)0x0;
        pAVar2 = pAVar2->next_) {
      pAVar1 = pAVar2->next_;
      if ((pAVar1 != (AccountingTestMemoryAllocatorMemoryNode *)0x0) && (pAVar1->memory_ == memory))
      {
        pAVar2->next_ = pAVar1->next_;
        sVar3 = pAVar1->size_;
        pTVar4 = this->originalAllocator_;
        pp_Var6 = pTVar4->_vptr_TestMemoryAllocator;
        uVar5 = 0x288;
        goto LAB_002b6660;
      }
    }
  }
  else {
    this->head_ = pAVar1->next_;
    sVar3 = pAVar1->size_;
    pTVar4 = this->originalAllocator_;
    pp_Var6 = pTVar4->_vptr_TestMemoryAllocator;
    uVar5 = 0x292;
LAB_002b6660:
    (*pp_Var6[3])(pTVar4,pAVar1,sVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                  ,uVar5);
  }
  return sVar3;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize(char* memory)
{
    if (head_ && head_->memory_ == memory)
        return removeHeadAndReturnSize();

    for (AccountingTestMemoryAllocatorMemoryNode* node = head_; node; node = node->next_) {
        if (node->next_ && node->next_->memory_ == memory)
            return removeNextNodeAndReturnSize(node);
    }

    return 0;
}